

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_inlines_b.h
# Opt level: O2

void arena_dalloc_no_tcache(tsdn_t *tsdn,void *ptr)

{
  uintptr_t in_RCX;
  uintptr_t in_R8;
  rtree_t *prVar1;
  rtree_metadata_t rVar2;
  rtree_ctx_t rtree_ctx_fallback;
  rtree_contents_t local_1b8;
  
  if (tsdn == (tsdn_t *)0x0) {
    prVar1 = (rtree_t *)&stack0xfffffffffffffe60;
    duckdb_je_rtree_ctx_data_init((rtree_ctx_t *)prVar1);
  }
  else {
    prVar1 = (rtree_t *)&(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx
    ;
  }
  rVar2 = rtree_metadata_read(tsdn,prVar1,(rtree_ctx_t *)ptr,in_RCX);
  if ((rVar2._8_4_ >> 8 & 1) == 0) {
    if (tsdn == (tsdn_t *)0x0) {
      prVar1 = (rtree_t *)&stack0xfffffffffffffe60;
      duckdb_je_rtree_ctx_data_init((rtree_ctx_t *)prVar1);
    }
    else {
      prVar1 = (rtree_t *)
               &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
    }
    rtree_read(&local_1b8,tsdn,prVar1,(rtree_ctx_t *)ptr,in_R8);
    duckdb_je_large_dalloc(tsdn,local_1b8.edata);
  }
  else {
    duckdb_je_arena_dalloc_small(tsdn,ptr);
  }
  return;
}

Assistant:

static inline void
arena_dalloc_no_tcache(tsdn_t *tsdn, void *ptr) {
	assert(ptr != NULL);

	emap_alloc_ctx_t alloc_ctx;
	emap_alloc_ctx_lookup(tsdn, &arena_emap_global, ptr, &alloc_ctx);

	if (config_debug) {
		edata_t *edata = emap_edata_lookup(tsdn, &arena_emap_global,
		    ptr);
		assert(alloc_ctx.szind == edata_szind_get(edata));
		assert(alloc_ctx.szind < SC_NSIZES);
		assert(alloc_ctx.slab == edata_slab_get(edata));
	}

	if (likely(alloc_ctx.slab)) {
		/* Small allocation. */
		arena_dalloc_small(tsdn, ptr);
	} else {
		arena_dalloc_large_no_tcache(tsdn, ptr, alloc_ctx.szind);
	}
}